

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum.cpp
# Opt level: O2

void __thiscall
clickhouse::ColumnEnum<signed_char>::ColumnEnum
          (ColumnEnum<signed_char> *this,TypeRef *type,
          vector<signed_char,_std::allocator<signed_char>_> *data)

{
  __shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2> _Stack_28;
  
  std::__shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&_Stack_28,&type->super___shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2>);
  Column::Column(&this->super_Column,(TypeRef *)&_Stack_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_28._M_refcount);
  (this->super_Column)._vptr_Column = (_func_int **)&PTR__ColumnEnum_00185bb0;
  std::vector<signed_char,_std::allocator<signed_char>_>::vector(&this->data_,data);
  return;
}

Assistant:

ColumnEnum<T>::ColumnEnum(TypeRef type, const std::vector<T>& data)
    : Column(type)
    , data_(data)
{
}